

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.h
# Opt level: O2

void __thiscall Rand::reseed(Rand *this,uint32_t seed)

{
  int iVar1;
  bool bVar2;
  
  this->x = seed ^ 0x498b3bc5;
  this->y = 0;
  this->z = 0;
  this->w = 0;
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    mix(this);
  }
  return;
}

Assistant:

void reseed ( uint32_t seed )
  {
    x = 0x498b3bc5 ^ seed;
    y = 0;
    z = 0;
    w = 0;

    for(int i = 0; i < 10; i++) mix();
  }